

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.hpp
# Opt level: O2

bool __thiscall openjij::graph::Sparse<float>::set_adj_node(Sparse<float> *this,Index from,Index to)

{
  ulong uVar1;
  pointer pvVar2;
  uint __line;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  char *__assertion;
  Index to_local;
  
  uVar1 = (this->super_Graph)._num_spins;
  to_local = to;
  if (from < uVar1) {
    if (to < uVar1) {
      pvVar2 = (this->_list_adj_nodes).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                        (pvVar2[from].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         *(pointer *)
                          ((long)&pvVar2[from].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + 8),&to_local);
      if (_Var3._M_current ==
          *(pointer *)
           ((long)&pvVar2[from].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data + 8)) {
        if (this->_num_edges <=
            (ulong)((long)_Var3._M_current -
                    (long)pvVar2[from].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3)) {
          __assertion = "nodes.size() < _num_edges";
          __line = 0x5c;
          goto LAB_0019720f;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (pvVar2 + from,&to_local);
        set_adj_node(this,to_local,from);
      }
      return true;
    }
    __assertion = "to < this->get_num_spins()";
    __line = 0x53;
  }
  else {
    __assertion = "from < this->get_num_spins()";
    __line = 0x52;
  }
LAB_0019720f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/sparse.hpp"
                ,__line,
                "bool openjij::graph::Sparse<float>::set_adj_node(Index, Index) [FloatType = float]"
               );
}

Assistant:

inline bool set_adj_node(Index from, Index to) {
    assert(from < this->get_num_spins());
    assert(to < this->get_num_spins());

    // get adjacent nodes of node "from"
    Nodes &nodes = _list_adj_nodes[from];
    // check if the node "to" exists in the nodes
    if (std::find(nodes.begin(), nodes.end(), to) == nodes.end()) {
      // nodes size must be smaller than num_edges

#ifndef NDEBUG
      assert(nodes.size() < _num_edges);
#else
      // return false
      if (nodes.size() >= _num_edges)
        return false;
#endif
      // add node
      nodes.push_back(to);
      // add node from "to" to "from"
      set_adj_node(to, from);
    }
    return true;
  }